

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

void __thiscall
skiplist<int,_std::less<int>_>::insert(skiplist<int,_std::less<int>_> *this,int value)

{
  bool bVar1;
  reference ppSVar2;
  SLNode<int> *pSVar3;
  result_type_conflict rVar4;
  bool local_a2;
  bool local_a1;
  value_type local_70;
  SLNode<int> *keyd;
  SLNode<int> *node;
  value_type local_58;
  SLNode<int> *follow;
  vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> history;
  SLNode<int> *keyd_1;
  SLNode<int> *local_20;
  SLNode<int> *node_1;
  skiplist<int,_std::less<int>_> *psStack_10;
  int value_local;
  skiplist<int,_std::less<int>_> *this_local;
  
  this->size_ = this->size_ + 1;
  node_1._4_4_ = value;
  psStack_10 = this;
  bVar1 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::empty(&this->key);
  if (bVar1) {
    local_20 = (SLNode<int> *)operator_new(0x48);
    SLNode<int>::SLNode(local_20,node_1._4_4_);
    pSVar3 = (SLNode<int> *)operator_new(0x48);
    SLNode<int>::SLNode(pSVar3);
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pSVar3;
    std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back
              (&this->key,
               (value_type *)
               &history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::operator[](&this->key,0);
    (*ppSVar2)->next = local_20;
    ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::operator[](&this->key,0);
    local_20->back = *ppSVar2;
    this->last = local_20;
    std::vector<int,_std::allocator<int>_>::push_back
              (&local_20->valz,(value_type *)((long)&node_1 + 4));
    while (rVar4 = std::uniform_real_distribution<double>::operator()(&this->dist_,&this->mt_),
          0.5 < rVar4) {
      pSVar3 = (SLNode<int> *)operator_new(0x48);
      SLNode<int>::SLNode(pSVar3,node_1._4_4_);
      local_20->up = pSVar3;
      local_20->up->down = local_20;
      local_20 = local_20->up;
      pSVar3 = (SLNode<int> *)operator_new(0x48);
      SLNode<int>::SLNode(pSVar3);
      history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[2] = pSVar3;
      history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[2]->down =
           (SLNode<int> *)
           history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[2]->back;
      ((SLNode<int> *)
      history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->next = local_20;
      local_20->back =
           (SLNode<int> *)
           history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back
                (&this->key,
                 (value_type *)
                 &history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::vector
              ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
    ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::back(&this->key);
    for (local_58 = *ppSVar2; local_58->down != (SLNode<int> *)0x0; local_58 = local_58->down) {
      while( true ) {
        local_a1 = false;
        if (local_58->next != (SLNode<int> *)0x0) {
          local_a1 = std::less<int>::operator()
                               ((less<int> *)&this->field_0xa00,&local_58->next->val,
                                (int *)((long)&node_1 + 4));
        }
        if (local_a1 == false) break;
        local_58 = local_58->next;
      }
      std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back
                ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow,&local_58);
    }
    while( true ) {
      local_a2 = false;
      if (local_58->next != (SLNode<int> *)0x0) {
        local_a2 = std::less<int>::operator()
                             ((less<int> *)&this->field_0xa00,&local_58->next->val,
                              (int *)((long)&node_1 + 4));
      }
      if (local_a2 == false) break;
      local_58 = local_58->next;
    }
    if ((local_58->next == (SLNode<int> *)0x0) ||
       (bVar1 = _420_is_equal<int,std::less<int>>(&local_58->next->val,(long)&node_1 + 4), !bVar1))
    {
      pSVar3 = (SLNode<int> *)operator_new(0x48);
      SLNode<int>::SLNode(pSVar3,node_1._4_4_);
      keyd = pSVar3;
      ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::back(&this->key);
      local_70 = *ppSVar2;
      keyd->next = local_58->next;
      keyd->back = local_58;
      if (local_58->next != (SLNode<int> *)0x0) {
        local_58->next->back = keyd;
      }
      local_58->next = keyd;
      if (keyd->next == (SLNode<int> *)0x0) {
        this->last = keyd;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                (&keyd->valz,(value_type *)((long)&node_1 + 4));
      while (rVar4 = std::uniform_real_distribution<double>::operator()(&this->dist_,&this->mt_),
            0.5 < rVar4) {
        pSVar3 = (SLNode<int> *)operator_new(0x48);
        SLNode<int>::SLNode(pSVar3,node_1._4_4_);
        keyd->up = pSVar3;
        keyd->up->down = keyd;
        keyd = keyd->up;
        bVar1 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::empty
                          ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
        if (bVar1) {
          pSVar3 = (SLNode<int> *)operator_new(0x48);
          SLNode<int>::SLNode(pSVar3);
          local_70->up = pSVar3;
          local_70->up->down = local_70;
          local_70 = local_70->up;
          local_70->next = keyd;
          keyd->back = local_70;
          std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back
                    (&this->key,&local_70);
        }
        else {
          ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::back
                              ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
          keyd->next = (*ppSVar2)->next;
          ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::back
                              ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
          pSVar3 = keyd;
          keyd->back = *ppSVar2;
          ppSVar2 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::back
                              ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
          (*ppSVar2)->next = pSVar3;
          std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::pop_back
                    ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
        }
      }
      node._0_4_ = 0;
    }
    else {
      local_58 = local_58->next;
      local_58->count = local_58->count + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                (&local_58->valz,(value_type *)((long)&node_1 + 4));
      node._0_4_ = 1;
    }
    std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::~vector
              ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)&follow);
  }
  return;
}

Assistant:

void skiplist<T, X>::insert(T value) {
    ++size_;

    // If entire container empty
    if(key.empty()) {
        SLNode<T> *node = new SLNode<T>(value);
        SLNode<T> *keyd = new SLNode<T>();
        key.push_back(keyd);
        key[0]->next = node;
        node->back = key[0];
        last = node;
        // Put the value into the store
        node->valz.push_back(value);
        // Now insert some more, probabilistically
        while(this->dist_(this->mt_) > 0.5) {
            node->up = new SLNode<T>(value);
            node->up->down = node;
            node = node->up;

            keyd->up = new SLNode<T>();
            keyd->up->down = keyd;
            keyd = keyd->up;

            keyd->next = node;
            node->back = keyd;
            key.push_back(keyd);
        }
        return;
    }
    // Else
    // Find the correct position, insert
    // If not exists, create upper levels for that element

    // This is the prev nodes for all levels
    std::vector<SLNode<T>*> history;
    // Search always starts from the upper left node
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val,value))
            follow = follow->next;
        history.push_back(follow);
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val,value))
        follow = follow->next;

    // If node already exists, add the new value to the store
    if(follow->next && _420_is_equal(follow->next->val, value, compare)) {
        follow = follow->next;
        follow->count++;
        follow->valz.push_back(value);
        return;
    }

    // Value does not exist. Insert a new node
    SLNode<T> *node = new SLNode<T>(value), *keyd = key.back();
    node->next = follow->next;
    node->back = follow;
    if(follow->next)
        follow->next->back = node;
    follow->next = node;
    if(!node->next)
        last = node;
    // Add into storage
    node->valz.push_back(value);

    // Probabilistically add more levels
    while(this->dist_(this->mt_) > 0.5) {
        node->up = new SLNode<T>(value);
        node->up->down = node;
        node = node->up;
        if(!history.empty()) {
            node->next = history.back()->next;
            node->back = history.back();
            history.back()->next = node;
            history.pop_back();
        }
        else {
            // add directly to the key
            // mess around with the pointers
            keyd->up = new SLNode<T>();
            keyd->up->down = keyd;
            keyd = keyd->up;

            keyd->next = node;
            node->back = keyd;
            key.push_back(keyd);
        }
    }
}